

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile
          (DeepScanLineInputFile *this,IStream *is,int numThreads)

{
  char *filename;
  ContextInitializer *ctxtinit;
  ContextInitializer local_98;
  
  filename = IStream::fileName(is);
  local_98._prov_stream = (IStream *)0x0;
  local_98._initializer.size = 0x68;
  local_98._initializer.error_handler_fn = (exr_error_handler_cb_t)0x0;
  local_98._initializer.alloc_fn = (exr_memory_allocation_func_t)0x0;
  local_98._initializer.free_fn = (exr_memory_free_func_t)0x0;
  local_98._initializer.user_data = (void *)0x0;
  local_98._initializer.read_fn = (exr_read_func_ptr_t)0x0;
  local_98._initializer.size_fn = (exr_query_size_func_ptr_t)0x0;
  local_98._initializer.write_fn = (exr_write_func_ptr_t)0x0;
  local_98._initializer.destroy_fn = (exr_destroy_stream_func_ptr_t)0x0;
  local_98._initializer.max_image_width = 0;
  local_98._initializer.max_image_height = 0;
  local_98._initializer.max_tile_width = 0;
  local_98._initializer.max_tile_height = 0;
  local_98._initializer.zip_level = -2;
  local_98._initializer.dwa_quality = -1.0;
  local_98._initializer.flags = 2;
  local_98._initializer.pad[0] = '\0';
  local_98._initializer.pad[1] = '\0';
  local_98._initializer.pad[2] = '\0';
  local_98._initializer.pad[3] = '\0';
  local_98._ctxt_type = TEMP;
  local_98._108_4_ = 0;
  ctxtinit = ContextInitializer::setInputStream(&local_98,is);
  DeepScanLineInputFile(this,filename,ctxtinit,numThreads);
  return;
}

Assistant:

DeepScanLineInputFile::DeepScanLineInputFile (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int numThreads)
    : DeepScanLineInputFile (
        is.fileName (),
        ContextInitializer ()
        .silentHeaderParse (true)
        .strictHeaderValidation (false)
        .setInputStream (&is),
        numThreads)
{
}